

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O1

void g2d_polygon_closest_boundary_point(zarray_t *poly,double *q,double *p)

{
  long lVar1;
  char *pcVar2;
  float fVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  double thisp [2];
  g2d_line_segment_t seg;
  double local_98;
  double dStack_90;
  double *local_80;
  double local_78;
  double local_70;
  long local_68;
  g2d_line_segment_t local_60;
  
  local_80 = p;
  if (poly == (zarray_t *)0x0) {
    __assert_fail("za != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/./common/zarray.h"
                  ,0x84,"int zarray_size(const zarray_t *)");
  }
  lVar7 = (long)poly->size;
  if (0 < lVar7) {
    local_68 = lVar7 + -1;
    fVar3 = INFINITY;
    lVar4 = 0;
    do {
      if (poly->size <= lVar4) {
LAB_003f480f:
        __assert_fail("idx < za->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/./common/zarray.h"
                      ,0xd9,"void zarray_get_volatile(const zarray_t *, int, void *)");
      }
      lVar1 = lVar4 + 1;
      uVar5 = (uint)lVar1;
      if (local_68 == lVar4) {
        uVar5 = 0;
      }
      if (poly->size <= (int)uVar5) goto LAB_003f480f;
      pcVar2 = poly->data;
      lVar4 = lVar4 * poly->el_sz;
      lVar6 = (ulong)uVar5 * poly->el_sz;
      local_60.line.p[0] = *(double *)(pcVar2 + lVar4);
      local_60.line.p[1] = *(double *)(pcVar2 + lVar4 + 8);
      local_60.line.u[0] = *(double *)(pcVar2 + lVar6) - local_60.line.p[0];
      local_60.line.u[1] = *(double *)(pcVar2 + lVar6 + 8) - local_60.line.p[1];
      fVar8 = (float)(local_60.line.u[1] * local_60.line.u[1] +
                     local_60.line.u[0] * local_60.line.u[0]);
      if (fVar8 < 0.0) {
        local_78 = local_60.line.u[1];
        local_70 = local_60.line.u[0];
        fVar8 = sqrtf(fVar8);
        local_60.line.u[0] = local_70;
        local_60.line.u[1] = local_78;
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      local_60.line.u[0] = local_60.line.u[0] / (double)fVar8;
      local_60.line.u[1] = local_60.line.u[1] / (double)fVar8;
      local_60.p1[0] = *(double *)(pcVar2 + lVar6);
      local_60.p1[1] = *(double *)(pcVar2 + lVar6 + 8);
      g2d_line_segment_closest_point(&local_60,q,&local_98);
      fVar8 = (float)((q[1] - dStack_90) * (q[1] - dStack_90) + (*q - local_98) * (*q - local_98));
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      if (fVar8 < fVar3) {
        *local_80 = local_98;
        local_80[1] = dStack_90;
        fVar3 = fVar8;
      }
      lVar4 = lVar1;
    } while (lVar7 != lVar1);
  }
  return;
}

Assistant:

void g2d_polygon_closest_boundary_point(const zarray_t *poly, const double q[2], double *p)
{
    int psz = zarray_size(poly);
    double min_dist = HUGE_VALF;

    for (int i = 0; i < psz; i++) {
        double *p0, *p1;

        zarray_get_volatile(poly, i, &p0);
        zarray_get_volatile(poly, (i+1) % psz, &p1);

        g2d_line_segment_t seg;
        g2d_line_segment_init_from_points(&seg, p0, p1);

        double thisp[2];
        g2d_line_segment_closest_point(&seg, q, thisp);

        double dist = g2d_distance(q, thisp);
        if (dist < min_dist) {
            memcpy(p, thisp, sizeof(double[2]));
            min_dist = dist;
        }
    }
}